

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestRecursiveMapMessage>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,proto2_unittest::TestRecursiveMapMessage>::
TryEmplaceInternal<char_const(&)[1]>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestRecursiveMapMessage>::iterator,_bool>
           *__return_storage_ptr__,void *this,char (*k) [1])

{
  NodeBase *pNVar1;
  bool bVar2;
  size_t sVar3;
  uint64_t uVar4;
  NodeBase *node;
  uintptr_t v_1;
  uint64_t v;
  uchar *bytes;
  map_index_t b;
  ulong uVar5;
  long lVar6;
  ViewType k_00;
  NodeAndBucket NVar7;
  NodeBase *local_58;
  NodeBase *local_50;
  NodeBase local_48;
  NodeBase *pNStack_40;
  ThreadSafeArena *local_38;
  
  sVar3 = strlen(*k);
  k_00._M_str = *k;
  k_00._M_len = sVar3;
  NVar7 = protobuf::internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,k_00);
  node = NVar7.node;
  b = NVar7.bucket;
  if (node == (NodeBase *)0x0) {
    bVar2 = protobuf::internal::
            KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,(ulong)(*this + 1));
    if (bVar2) {
      sVar3 = strlen(*k);
      uVar4 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                        (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,k,sVar3);
      uVar5 = (uVar4 ^ sVar3) * -0x234dd359734ecb13;
      uVar5 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
               uVar5 << 0x38) ^ *(ulong *)((long)this + 0x10)) * -0x234dd359734ecb13;
      lVar6 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
               uVar5 << 0x38) ^ *(ulong *)((long)this + 0x10)) * -0x234dd359734ecb13;
      b = ((uint)(byte)((ulong)lVar6 >> 0x38) | ((uint)((ulong)lVar6 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar6 >> 0x18) & 0xff0000 | (uint)((ulong)lVar6 >> 8) & 0xff000000) &
          *(int *)((long)this + 4) - 1U;
    }
    node = protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x70);
    local_38 = *(ThreadSafeArena **)((long)this + 0x18);
    local_58 = &local_48;
    sVar3 = strlen(*k);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,k,k + sVar3);
    pNVar1 = node + 3;
    node[1].next = pNVar1;
    if (local_58 == &local_48) {
      pNVar1->next = (NodeBase *)CONCAT71(local_48.next._1_7_,local_48.next._0_1_);
      node[4].next = pNStack_40;
    }
    else {
      node[1].next = local_58;
      pNVar1->next = (NodeBase *)CONCAT71(local_48.next._1_7_,local_48.next._0_1_);
    }
    node[2].next = local_50;
    local_50 = (NodeBase *)0x0;
    local_48.next._0_1_ = 0;
    local_58 = &local_48;
    if (local_38 != (ThreadSafeArena *)0x0) {
      protobuf::internal::ThreadSafeArena::AddCleanup
                (local_38,node + 1,
                 protobuf::internal::cleanup::arena_destruct_object<std::__cxx11::string>);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(local_48.next._1_7_,local_48.next._0_1_) + 1);
    }
    proto2_unittest::TestRecursiveMapMessage::TestRecursiveMapMessage
              ((TestRecursiveMapMessage *)(node + 5),*(Arena **)((long)this + 0x18));
    protobuf::internal::
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,b,(KeyNode *)node);
    *(int *)this = *this + 1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = node;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = b;
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }